

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O2

int cupdlp_dcs_sprealloc(cupdlp_dcs *A,int nzmax)

{
  int *piVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int okj;
  int okx;
  int oki;
  
  iVar3 = 1;
  if (A == (cupdlp_dcs *)0x0) {
    iVar4 = 0;
  }
  else {
    if ((nzmax < 1) && (nzmax = A->nz, nzmax == -1)) {
      nzmax = A->p[A->n];
    }
    if (nzmax < 2) {
      nzmax = iVar3;
    }
    okj = iVar3;
    okx = iVar3;
    piVar1 = (int *)cupdlp_dcs_realloc(A->i,nzmax,4,&oki);
    A->i = piVar1;
    if (-1 < A->nz) {
      piVar1 = (int *)cupdlp_dcs_realloc(A->p,nzmax,4,&okj);
      A->p = piVar1;
    }
    iVar4 = 0;
    if (A->x == (double *)0x0) {
      bVar5 = false;
    }
    else {
      pdVar2 = (double *)cupdlp_dcs_realloc(A->x,nzmax,8,&okx);
      A->x = pdVar2;
      bVar5 = okx == 0;
    }
    if (((oki != 0) && (okj != 0)) && (!bVar5)) {
      A->nzmax = nzmax;
      iVar4 = iVar3;
    }
  }
  return iVar4;
}

Assistant:

int cupdlp_dcs_sprealloc(cupdlp_dcs *A, int nzmax) {
  int ok, oki, okj = 1, okx = 1;
  if (!A) return (0);
  if (nzmax <= 0) nzmax = IS_CSC(A) ? (A->p[A->n]) : A->nz;
  nzmax = MAX(nzmax, 1);
  A->i = cupdlp_dcs_realloc(A->i, nzmax, sizeof(int), &oki);
  if (IS_TRIPLET(A)) A->p = cupdlp_dcs_realloc(A->p, nzmax, sizeof(int), &okj);
  if (A->x) A->x = cupdlp_dcs_realloc(A->x, nzmax, sizeof(double), &okx);
  ok = (oki && okj && okx);
  if (ok) A->nzmax = nzmax;
  return (ok);
}